

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

ident * newident(char *name,int flags)

{
  char *s;
  bool bVar1;
  ident *piVar2;
  char *local_58;
  ident local_50;
  
  local_58 = name;
  piVar2 = hashset<ident>::access<char_const*>(&idents,&local_58);
  s = local_58;
  if (piVar2 == (ident *)0x0) {
    bVar1 = checknumber(local_58);
    if (bVar1) {
      debugcode("number %s is not a valid identifier name",s);
      piVar2 = dummyident;
    }
    else {
      local_50.name = newstring(s);
      local_50.type = 4;
      local_50.field_2.minval = 0;
      local_50.field_3.code = (uint *)0x0;
      local_50.field_5.stack = (identstack *)0x0;
      local_50.flags = flags;
      piVar2 = addident(&local_50);
    }
  }
  return piVar2;
}

Assistant:

ident *newident(const char *name, int flags)
{
    ident *id = idents.access(name);
    if(!id)
    {
        if(checknumber(name))
        {
            debugcode("number %s is not a valid identifier name", name);
            return dummyident;
        }
        id = addident(ident(ID_ALIAS, newstring(name), flags));
    }
    return id;
}